

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
rest_rpc::req_result::as<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,req_result *this)

{
  const_pointer pcVar1;
  bool bVar2;
  logic_error *this_00;
  size_type in_RCX;
  size_type in_RDX;
  string_view result;
  string_view result_00;
  string_view result_01;
  string err_msg;
  
  result.size_ = in_RDX;
  result.data_ = (const_pointer)(this->data_)._M_string_length;
  bVar2 = has_error((rest_rpc *)(this->data_)._M_dataplus._M_p,result);
  if (!bVar2) {
    result_00.size_ = in_RCX;
    result_00.data_ = (const_pointer)(this->data_)._M_string_length;
    get_result<std::__cxx11::string>
              (__return_storage_ptr__,(rest_rpc *)(this->data_)._M_dataplus._M_p,result_00);
    return __return_storage_ptr__;
  }
  pcVar1 = (const_pointer)(this->data_)._M_string_length;
  if (pcVar1 == (const_pointer)0x0) {
    std::__cxx11::string::string((string *)&err_msg,(string *)this);
  }
  else {
    result_01.size_ = in_RCX;
    result_01.data_ = pcVar1;
    get_error_msg_abi_cxx11_(&err_msg,(rest_rpc *)(this->data_)._M_dataplus._M_p,result_01);
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,(string *)&err_msg);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

T as() {
    if (has_error(data_)) {
      std::string err_msg = data_.empty() ? data_ : get_error_msg(data_);
      throw std::logic_error(err_msg);
    }

    return get_result<T>(data_);
  }